

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  Ch *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  ulong i;
  ulong uVar8;
  uint i_00;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pbVar15 = (byte *)is->src_;
  bVar1 = *pbVar15;
  bVar6 = bVar1;
  if (bVar1 == 0x2d) {
    pbVar16 = pbVar15 + 1;
    pbVar15 = pbVar15 + 1;
    bVar6 = *pbVar16;
  }
  pCVar2 = is->head_;
  if (bVar6 == 0x30) {
    uVar12 = (uint)pbVar15[1];
    pbVar16 = pbVar15 + 1;
    dVar17 = 0.0;
    bVar7 = false;
    bVar3 = false;
    uVar8 = 0;
    i = 0;
    bVar4 = false;
    i_00 = 0;
    goto LAB_00123ca6;
  }
  if ((byte)(bVar6 - 0x31) < 9) {
    i_00 = bVar6 - 0x30;
    uVar8 = 0;
    if (bVar1 == 0x2d) {
LAB_00123b44:
      bVar6 = pbVar15[uVar8 + 1];
      uVar14 = (ulong)bVar6;
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_00123bc4;
      if (i_00 < 0xccccccc) {
LAB_00123b66:
        i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
        uVar8 = uVar8 + 1;
        goto LAB_00123b44;
      }
      if (i_00 != 0xccccccc) goto LAB_00123bef;
      if (bVar6 < 0x39) goto LAB_00123b66;
      i_00 = 0xccccccc;
      uVar14 = 0x39;
LAB_00123bef:
      pbVar16 = pbVar15 + uVar8 + 1;
      i = (ulong)i_00;
      if (bVar1 == 0x2d) {
        while( true ) {
          uVar12 = (uint)uVar14;
          if (9 < (byte)((byte)uVar14 - 0x30)) break;
          if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || (0x38 < (byte)uVar14))))
          goto LAB_00123f26;
          i = (uVar14 & 0xf) + i * 10;
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar14 = (ulong)pbVar16[1];
          pbVar16 = pbVar16 + 1;
        }
      }
      else {
        while( true ) {
          uVar12 = (uint)uVar14;
          if (9 < (byte)((byte)uVar14 - 0x30)) break;
          if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || (0x35 < (byte)uVar14))))
          goto LAB_00123f26;
          i = (uVar14 & 0xf) + i * 10;
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar14 = (ulong)pbVar16[1];
          pbVar16 = pbVar16 + 1;
        }
      }
      dVar17 = 0.0;
      bVar7 = false;
      bVar3 = false;
      goto LAB_00123ca3;
    }
    while( true ) {
      bVar6 = pbVar15[uVar8 + 1];
      uVar14 = (ulong)bVar6;
      if (9 < (byte)(bVar6 - 0x30)) break;
      if (0x19999998 < i_00) {
        if (i_00 != 0x19999999) goto LAB_00123bef;
        if (0x35 < bVar6) {
          i_00 = 0x19999999;
          goto LAB_00123bef;
        }
      }
      i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
      uVar8 = uVar8 + 1;
    }
LAB_00123bc4:
    uVar12 = (uint)bVar6;
    pbVar16 = pbVar15 + uVar8 + 1;
    dVar17 = 0.0;
    bVar7 = false;
    bVar3 = false;
    i = 0;
    bVar4 = false;
    goto LAB_00123ca6;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x335,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  pbVar10 = pbVar15 + -(long)pCVar2;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0012405e;
LAB_00123f26:
  auVar20._8_4_ = (int)(i >> 0x20);
  auVar20._0_8_ = i;
  auVar20._12_4_ = 0x45300000;
  dVar17 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  pbVar10 = pbVar16 + -(long)pCVar2;
  while (uVar12 = (uint)uVar14, (byte)((char)uVar14 - 0x30U) < 10) {
    if (1.7976931348623158e+307 <= dVar17) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x357,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_00124052;
    }
    dVar17 = dVar17 * 10.0 + (double)(int)(uVar12 - 0x30);
    pbVar15 = pbVar16 + 1;
    pbVar16 = pbVar16 + 1;
    pbVar10 = pbVar10 + 1;
    uVar14 = (ulong)*pbVar15;
  }
  bVar7 = true;
  bVar3 = true;
LAB_00123ca3:
  bVar4 = true;
LAB_00123ca6:
  if ((char)uVar12 == '.') {
    uVar12 = (uint)pbVar16[1];
    pbVar15 = pbVar16 + 1;
    if (9 < (byte)(pbVar16[1] - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x364,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar10 = pbVar15 + -(long)pCVar2;
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_0012405e;
    }
    iVar11 = 0;
    pbVar16 = pbVar15;
    if (!bVar7) {
      if (!bVar4) {
        i = (ulong)i_00;
      }
      iVar11 = 0;
      while ((('/' < (char)(byte)uVar12 && ((byte)uVar12 < 0x3a)) && (i >> 0x35 == 0))) {
        pbVar16 = pbVar15 + 1;
        pbVar15 = pbVar15 + 1;
        iVar11 = iVar11 + -1;
        i = (ulong)(uVar12 - 0x30) + i * 10;
        uVar8 = (ulong)((int)uVar8 + (uint)(i != 0));
        uVar12 = (uint)*pbVar16;
      }
      auVar19._8_4_ = (int)(i >> 0x20);
      auVar19._0_8_ = i;
      auVar19._12_4_ = 0x45300000;
      dVar17 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar3 = true;
      pbVar16 = pbVar15;
    }
    while ('/' < (char)(byte)uVar12) {
      if (0x39 < (byte)uVar12) goto LAB_00123d27;
      if ((int)uVar8 < 0x11) {
        dVar17 = dVar17 * 10.0 + (double)(int)(uVar12 - 0x30);
        iVar11 = iVar11 + -1;
        if (0.0 < dVar17) {
          uVar8 = (ulong)((int)uVar8 + 1);
        }
      }
      uVar12 = (uint)pbVar16[1];
      pbVar16 = pbVar16 + 1;
    }
    iVar9 = 0;
LAB_00123fa6:
    if (bVar3) {
      dVar17 = internal::StrtodNormalPrecision(dVar17,iVar9 + iVar11);
      if (bVar1 == 0x2d) {
        dVar17 = -dVar17;
      }
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Double(handler,dVar17);
    }
    else if (bVar4) {
      if (bVar1 == 0x2d) {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i);
      }
      else {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i);
      }
    }
    else if (bVar1 == 0x2d) {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-i_00);
    }
    else {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,i_00);
    }
    pbVar15 = pbVar16;
    if (bVar7 != false) goto LAB_00124062;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x3d6,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pbVar10 = pbVar16 + -(long)pCVar2;
    *(undefined4 *)(this + 0x30) = 0x10;
  }
  else {
    iVar11 = 0;
LAB_00123d27:
    iVar9 = 0;
    if ((uVar12 | 0x20) != 0x65) goto LAB_00123fa6;
    uVar8 = (ulong)i_00;
    if (bVar4) {
      uVar8 = i;
    }
    if (!bVar3) {
      auVar18._8_4_ = (int)(uVar8 >> 0x20);
      auVar18._0_8_ = uVar8;
      auVar18._12_4_ = 0x45300000;
      dVar17 = (auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
      bVar3 = true;
    }
    bVar6 = pbVar16[1];
    bVar7 = false;
    bVar5 = false;
    if (bVar6 == 0x2b) {
LAB_00123d8a:
      bVar7 = bVar5;
      bVar6 = pbVar16[2];
      pbVar15 = pbVar16 + 2;
    }
    else {
      if (bVar6 == 0x2d) {
        bVar5 = true;
        goto LAB_00123d8a;
      }
      pbVar15 = pbVar16 + 1;
    }
    if ((byte)(bVar6 - 0x30) < 10) {
      pbVar16 = pbVar15 + 1;
      iVar13 = bVar6 - 0x30;
      pbVar10 = pbVar16;
      if (bVar7) {
        while (pbVar16 = pbVar10, (byte)(*pbVar16 - 0x30) < 10) {
          iVar13 = iVar13 * 10 + (uint)*pbVar16 + -0x30;
          pbVar10 = pbVar16 + 1;
          if (0xccccccb < iVar13) {
            do {
              pbVar15 = pbVar16 + 1;
              pbVar16 = pbVar16 + 1;
              pbVar10 = pbVar16;
            } while ((byte)(*pbVar15 - 0x30) < 10);
          }
        }
LAB_00123f9b:
        iVar9 = -iVar13;
        if (!bVar7) {
          iVar9 = iVar13;
        }
        goto LAB_00123fa6;
      }
      pbVar10 = pbVar15 + (1 - (long)pCVar2);
      do {
        bVar6 = *pbVar16;
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_00123f9b;
        pbVar16 = pbVar16 + 1;
        iVar13 = iVar13 * 10 + (uint)bVar6 + -0x30;
        pbVar10 = pbVar10 + 1;
      } while (iVar13 <= 0x134 - iVar11);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3ae,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_00124052:
      *(undefined4 *)(this + 0x30) = 0xd;
      pbVar15 = pbVar16;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3b3,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar10 = pbVar15 + -(long)pCVar2;
      *(undefined4 *)(this + 0x30) = 0xf;
    }
  }
LAB_0012405e:
  *(byte **)(this + 0x38) = pbVar10;
LAB_00124062:
  is->src_ = (Ch *)pbVar15;
  is->head_ = pCVar2;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, (parseFlags & kParseFullPrecisionFlag) != 0> s(*this, copy.s);

        // Parse minus
        bool minus = false;
        if (s.Peek() == '-') {
            minus = true;
            s.Take();
        }

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (s.Peek() == '0') {
            i = 0;
            s.TakePush();
        }
        else if (s.Peek() >= '1' && s.Peek() <= '9') {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 214748364) { // 2^31 = 2147483648
                        if (i != 214748364 || s.Peek() > '8') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 429496729) { // 2^32 - 1 = 4294967295
                        if (i != 429496729 || s.Peek() > '5') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        double d = 0.0;
        if (use64bit) {
            if (minus) 
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                     if (i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC)) // 2^63 = 9223372036854775808
                        if (i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                    if (i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999)) // 2^64 - 1 = 18446744073709551615
                        if (i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (d >= 1.7976931348623157e307) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (s.Peek() == '.') {
            s.Take();
            decimalPosition = s.Length();

            if (!(s.Peek() >= '0' && s.Peek() <= '9'))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;
        
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = (double)i64;
#else
                // Use double to store significand in 32-bit architecture
                d = use64bit ? (double)i64 : (double)i;
#endif
                useDouble = true;
            }

            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (d > 0.0)
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (s.Peek() == 'e' || s.Peek() == 'E') {
            if (!useDouble) {
                d = use64bit ? i64 : i;
                useDouble = true;
            }
            s.Take();

            bool expMinus = false;
            if (s.Peek() == '+')
                s.Take();
            else if (s.Peek() == '-') {
                s.Take();
                expMinus = true;
            }

            if (s.Peek() >= '0' && s.Peek() <= '9') {
                exp = s.Take() - '0';
                if (expMinus) {
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (s.Peek() >= '0' && s.Peek() <= '9')  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp > maxExp)
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;
        size_t length = s.Length();
        const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

        if (useDouble) {
            int p = exp + expFrac;
            if (parseFlags & kParseFullPrecisionFlag)
                d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
            else
                d = internal::StrtodNormalPrecision(d, p);

            cont = handler.Double(minus ? -d : d);
        }
        else {
            if (use64bit) {
                if (minus)
                    cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                else
                    cont = handler.Uint64(i64);
            }
            else {
                if (minus)
                    cont = handler.Int(static_cast<int32_t>(~i + 1));
                else
                    cont = handler.Uint(i);
            }
        }
        if (!cont)
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }